

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllRgbWidget.cpp
# Opt level: O3

void __thiscall AllRgbWidget::SetTargetImage(AllRgbWidget *this,QImage *targetImage)

{
  QImage *this_00;
  undefined8 uVar1;
  char cVar2;
  QImage aQStack_68 [24];
  code *local_50 [2];
  undefined8 local_40;
  QSize local_38 [2];
  undefined8 local_28;
  
  this_00 = &this->target_;
  cVar2 = QImage::operator!=(targetImage,this_00);
  if (cVar2 != '\0') {
    QImage::operator=(this_00,targetImage);
    local_50[0] = (code *)0x6400000064;
    QImage::scaled(local_38,(AspectRatioMode)this_00,(TransformationMode)local_50);
    QPaintDevice::QPaintDevice((QPaintDevice *)local_50);
    uVar1 = local_28;
    local_50[0] = QImage::QImage;
    local_28 = 0;
    local_40 = *(undefined8 *)&this->field_0x88;
    *(undefined8 *)&this->field_0x88 = uVar1;
    QImage::~QImage((QImage *)local_50);
    QImage::~QImage((QImage *)local_38);
    QImage::QImage(aQStack_68,this_00);
    onTargetUpdated(this,aQStack_68);
    QImage::~QImage(aQStack_68);
    QWidget::update();
  }
  return;
}

Assistant:

void AllRgbWidget::SetTargetImage(const QImage& targetImage)
{
    if (targetImage != target_) {
        target_ = targetImage;
        targetThumbnail_ = target_.scaled(100, 100);
        emit onTargetUpdated(target_);
        update();
    }
}